

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O0

logger * __thiscall pstore::logger::to_string<unsigned_int>(logger *this,czstring message,uint t)

{
  __cxx11 local_40 [36];
  uint local_1c;
  czstring pcStack_18;
  uint t_local;
  czstring message_local;
  
  local_1c = t;
  pcStack_18 = message;
  message_local = (czstring)this;
  std::__cxx11::to_string(local_40,t);
  std::operator+((char *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message);
  std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

static std::string to_string (gsl::czstring const message, T const t) {
                return message + std::to_string (t);
            }